

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustring.cpp
# Opt level: O1

int32_t u_strcmp_63(UChar *s1,UChar *s2)

{
  ushort *puVar1;
  ushort uVar2;
  long lVar3;
  
  lVar3 = 0;
  do {
    uVar2 = *(ushort *)((long)s1 + lVar3);
    puVar1 = (ushort *)((long)s2 + lVar3);
    if (uVar2 == 0) break;
    lVar3 = lVar3 + 2;
  } while (uVar2 == *puVar1);
  return (uint)uVar2 - (uint)*puVar1;
}

Assistant:

U_CAPI int32_t   U_EXPORT2
u_strcmp(const UChar *s1, 
    const UChar *s2) 
{
    UChar  c1, c2;

    for(;;) {
        c1=*s1++;
        c2=*s2++;
        if (c1 != c2 || c1 == 0) {
            break;
        }
    }
    return (int32_t)c1 - (int32_t)c2;
}